

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O3

idx_t duckdb::UncompressedStringStorage::RemainingSpace(ColumnSegment *segment,BufferHandle *handle)

{
  uint uVar1;
  __int_type _Var2;
  idx_t iVar3;
  
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&handle->node);
  uVar1 = *(uint *)(((handle->node).ptr)->buffer + segment->offset);
  _Var2 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  iVar3 = ColumnSegment::SegmentSize(segment);
  return (iVar3 - ((ulong)uVar1 + _Var2 * 4)) - 8;
}

Assistant:

idx_t UncompressedStringStorage::RemainingSpace(ColumnSegment &segment, BufferHandle &handle) {
	auto dictionary = GetDictionary(segment, handle);
	D_ASSERT(dictionary.end == segment.SegmentSize());
	idx_t used_space = dictionary.size + segment.count * sizeof(int32_t) + DICTIONARY_HEADER_SIZE;
	D_ASSERT(segment.SegmentSize() >= used_space);
	return segment.SegmentSize() - used_space;
}